

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcalc.c
# Opt level: O0

void FT_Matrix_Multiply(FT_Matrix *a,FT_Matrix *b)

{
  FT_Long FVar1;
  FT_Long FVar2;
  FT_Long FVar3;
  FT_Long FVar4;
  FT_Long FVar5;
  FT_Long FVar6;
  FT_Long FVar7;
  FT_Long FVar8;
  FT_Fixed yy;
  FT_Fixed yx;
  FT_Fixed xy;
  FT_Fixed xx;
  FT_Matrix *b_local;
  FT_Matrix *a_local;
  
  if ((a != (FT_Matrix *)0x0) && (b != (FT_Matrix *)0x0)) {
    FVar1 = FT_MulFix(a->xx,b->xx);
    FVar2 = FT_MulFix(a->xy,b->yx);
    FVar3 = FT_MulFix(a->xx,b->xy);
    FVar4 = FT_MulFix(a->xy,b->yy);
    FVar5 = FT_MulFix(a->yx,b->xx);
    FVar6 = FT_MulFix(a->yy,b->yx);
    FVar7 = FT_MulFix(a->yx,b->xy);
    FVar8 = FT_MulFix(a->yy,b->yy);
    b->xx = FVar1 + FVar2;
    b->xy = FVar3 + FVar4;
    b->yx = FVar5 + FVar6;
    b->yy = FVar7 + FVar8;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Matrix_Multiply( const FT_Matrix*  a,
                      FT_Matrix        *b )
  {
    FT_Fixed  xx, xy, yx, yy;


    if ( !a || !b )
      return;

    xx = ADD_LONG( FT_MulFix( a->xx, b->xx ),
                   FT_MulFix( a->xy, b->yx ) );
    xy = ADD_LONG( FT_MulFix( a->xx, b->xy ),
                   FT_MulFix( a->xy, b->yy ) );
    yx = ADD_LONG( FT_MulFix( a->yx, b->xx ),
                   FT_MulFix( a->yy, b->yx ) );
    yy = ADD_LONG( FT_MulFix( a->yx, b->xy ),
                   FT_MulFix( a->yy, b->yy ) );

    b->xx = xx;
    b->xy = xy;
    b->yx = yx;
    b->yy = yy;
  }